

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int changeTempStorage(Parse *pParse,char *zStorageType)

{
  sqlite3 *psVar1;
  uint uVar2;
  int iVar3;
  sqlite3 *db;
  int ts;
  char *zStorageType_local;
  Parse *pParse_local;
  
  uVar2 = getTempStore(zStorageType);
  psVar1 = pParse->db;
  if (psVar1->temp_store == uVar2) {
    pParse_local._4_4_ = 0;
  }
  else {
    iVar3 = invalidateTempStorage(pParse);
    if (iVar3 == 0) {
      psVar1->temp_store = (u8)uVar2;
      pParse_local._4_4_ = 0;
    }
    else {
      pParse_local._4_4_ = 1;
    }
  }
  return pParse_local._4_4_;
}

Assistant:

static int changeTempStorage(Parse *pParse, const char *zStorageType){
  int ts = getTempStore(zStorageType);
  sqlite3 *db = pParse->db;
  if( db->temp_store==ts ) return SQLITE_OK;
  if( invalidateTempStorage( pParse ) != SQLITE_OK ){
    return SQLITE_ERROR;
  }
  db->temp_store = (u8)ts;
  return SQLITE_OK;
}